

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

void cJSON_AddItemReferenceToArray(cJSON *array,cJSON *item)

{
  cJSON *item_00;
  
  item_00 = create_reference(item,(internal_hooks *)item);
  cJSON_AddItemToArray(array,item_00);
  return;
}

Assistant:

CJSON_PUBLIC(void) cJSON_AddItemReferenceToArray(cJSON *array, cJSON *item)
{
    cJSON_AddItemToArray(array, create_reference(item, &global_hooks));
}